

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnixienumber.cpp
# Opt level: O3

void __thiscall QNixieNumber::paintEvent(QNixieNumber *this,QPaintEvent *param_1)

{
  mode_ mVar1;
  long lVar2;
  QPainter paint;
  undefined1 local_40 [8];
  double local_38;
  undefined8 local_30;
  
  QPainter::QPainter((QPainter *)local_40,(QPaintDevice *)&this->field_0x10);
  mVar1 = this->selectMode_;
  if (mVar1 == NIXIE) {
    if (this->segment_ < 1) goto LAB_001055d4;
    lVar2 = 0;
    do {
      local_38 = (double)(this->width_ * (int)lVar2);
      local_30 = 0;
      QPainter::drawPixmap((QPointF *)local_40,(QPixmap *)&local_38);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->segment_);
    mVar1 = this->selectMode_;
  }
  if ((mVar1 == REALNIXIE) && (0 < this->segment_)) {
    lVar2 = 0;
    do {
      local_38 = (double)(this->width_ * (int)lVar2);
      local_30 = 0;
      QPainter::drawPixmap((QPointF *)local_40,(QPixmap *)&local_38);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->segment_);
  }
LAB_001055d4:
  QWidget::update();
  QPainter::~QPainter((QPainter *)local_40);
  return;
}

Assistant:

void QNixieNumber::paintEvent(QPaintEvent *)
{
    QPainter paint(this);

    /* Based on the selected style, images (numbers) are drawn from the array */
    if(selectMode_ == NIXIE)
        for(int i = 0; i < segment_ ; ++i)
            paint.drawPixmap(width_ * i,0, NixieNumber[number[i]]);

    if(selectMode_ == REALNIXIE)
        for(int i = 0; i < segment_ ; ++i)
            paint.drawPixmap(width_ * i,0, RealNixieNumber[number[i]]);

    QNixieNumber::update();                                      // Automatic redrawing
}